

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyFEND.hpp
# Opt level: O2

void njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::section::Type<6>_>::
     verifyFEND(StructureDivision *structureDivision,long lineNumber)

{
  bool bVar1;
  undefined8 *puVar2;
  char *args;
  
  bVar1 = StructureDivision::isFend(structureDivision);
  if (bVar1) {
    return;
  }
  bVar1 = StructureDivision::isSend(structureDivision);
  if (bVar1) {
    args = "Encountered duplicate SEND record in File {}";
  }
  else {
    bVar1 = StructureDivision::isHead(structureDivision);
    if (bVar1) {
      tools::Log::error<char_const*,int>("Inappropriate section encountered in File {}",6);
      tools::Log::info<char_const*,int>
                ("Section number: {}",(structureDivision->tail).fields._M_elems[2]);
      goto LAB_00146915;
    }
    bVar1 = StructureDivision::isMend(structureDivision);
    if (bVar1) {
      args = "Encountered MEND record before FEND record in File {}";
    }
    else {
      bVar1 = StructureDivision::isTend(structureDivision);
      if (!bVar1) {
        return;
      }
      args = "Encountered TEND record before FEND record in File {}";
    }
  }
  tools::Log::error<char_const*,int>(args,6);
LAB_00146915:
  tools::Log::info<char_const*,long>("Line number: {}",lineNumber);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyFEND( const StructureDivision& structureDivision,
            long lineNumber ) {

  if ( not structureDivision.isFend() ) {

    int MF = Base::MF();
    if ( structureDivision.isSend() ) {

      Log::error( "Encountered duplicate SEND record in File {}", MF );
      Log::info("Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isHead() ) {

      Log::error( "Inappropriate section encountered in File {}", MF );
      Log::info( "Section number: {}", asHead( structureDivision ).section() );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isMend() ) {

      Log::error( "Encountered MEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isTend() ) {

      Log::error( "Encountered TEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
  }
}